

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryAdd<FadCst<double>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,FadBinaryAdd<FadCst<double>,_Fad<Fad<double>_>_> *this
          )

{
  int iVar1;
  Fad<Fad<double>_> *pFVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  
  pFVar2 = this->right_;
  __return_storage_ptr__->val_ = (this->left_).constant_ + (pFVar2->val_).val_;
  iVar1 = (pFVar2->val_).dx_.num_elts;
  lVar6 = (long)iVar1;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (lVar6 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = iVar1;
    pdVar4 = (double *)operator_new__(lVar6 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
    __return_storage_ptr__->defaultVal = 0.0;
    pdVar3 = (pFVar2->val_).dx_.ptr_to_data;
    lVar5 = 0;
    do {
      pdVar4[lVar5] = pdVar3[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}